

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Vector.cpp
# Opt level: O3

LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> * __thiscall
KDIS::DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>_>::operator+
          (LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> *__return_storage_ptr__
          ,LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> *this,
          LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> *Value)

{
  KFIXED<short,_(unsigned_char)__x03_> KStack_b8;
  KFIXED<short,_(unsigned_char)__x03_> local_a8;
  KFIXED<short,_(unsigned_char)__x03_> local_98;
  DataTypeBase local_88;
  short local_80;
  KFIXED<short,_(unsigned_char)__x03_> local_78;
  DataTypeBase local_68;
  short local_60;
  KFIXED<short,_(unsigned_char)__x03_> local_58;
  DataTypeBase local_48;
  short local_40;
  KFIXED<short,_(unsigned_char)__x03_> local_38;
  
  (__return_storage_ptr__->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__LE_Vector_00224f98;
  (__return_storage_ptr__->m_X).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00221bd0;
  (__return_storage_ptr__->m_X).m_Val = (this->m_X).m_Val;
  (__return_storage_ptr__->m_Y).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00221bd0;
  (__return_storage_ptr__->m_Y).m_Val = (this->m_Y).m_Val;
  (__return_storage_ptr__->m_Z).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00221bd0;
  (__return_storage_ptr__->m_Z).m_Val = (this->m_Z).m_Val;
  local_48._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00221bd0;
  local_40 = (Value->m_X).m_Val;
  KFIXED<short,_(unsigned_char)'\x03'>::operator+(&local_98,&__return_storage_ptr__->m_X);
  KFIXED<short,_(unsigned_char)'\x03'>::operator=(&local_38,&__return_storage_ptr__->m_X);
  DataTypeBase::~DataTypeBase(&local_38.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_98.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_48);
  local_68._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00221bd0;
  local_60 = (Value->m_Y).m_Val;
  KFIXED<short,_(unsigned_char)'\x03'>::operator+(&local_a8,&__return_storage_ptr__->m_Y);
  KFIXED<short,_(unsigned_char)'\x03'>::operator=(&local_58,&__return_storage_ptr__->m_Y);
  DataTypeBase::~DataTypeBase(&local_58.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_a8.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_68);
  local_88._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00221bd0;
  local_80 = (Value->m_Z).m_Val;
  KFIXED<short,_(unsigned_char)'\x03'>::operator+(&KStack_b8,&__return_storage_ptr__->m_Z);
  KFIXED<short,_(unsigned_char)'\x03'>::operator=(&local_78,&__return_storage_ptr__->m_Z);
  DataTypeBase::~DataTypeBase(&local_78.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&KStack_b8.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_88);
  return __return_storage_ptr__;
}

Assistant:

LE_Vector<Type> LE_Vector<Type>::operator + ( const LE_Vector & Value ) const
{
    LE_Vector tmp = *this;
    tmp.m_X = tmp.m_X + Value.m_X;
    tmp.m_Y = tmp.m_Y + Value.m_Y;
    tmp.m_Z = tmp.m_Z + Value.m_Z;
    return tmp;
}